

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

BVSparseNode * __thiscall
BVSparse<Memory::HeapAllocator>::NodeFromIndex
          (BVSparse<Memory::HeapAllocator> *this,BVIndex i,Type_conflict **prevNextFieldOut,
          bool create)

{
  BVSparse<Memory::HeapAllocator> *pBVar1;
  BVSparse<Memory::HeapAllocator> *pBVar2;
  uint searchIndex;
  BVSparse<Memory::HeapAllocator> *pBVar3;
  
  searchIndex = i & 0xffffffc0;
  pBVar3 = (BVSparse<Memory::HeapAllocator> *)this->lastUsedNodePrevNextField;
  pBVar1 = (BVSparse<Memory::HeapAllocator> *)pBVar3->head;
  if (pBVar1 == (BVSparse<Memory::HeapAllocator> *)0x0) {
LAB_006ed701:
    pBVar1 = (BVSparse<Memory::HeapAllocator> *)this->head;
    pBVar3 = this;
    if ((BVSparse<Memory::HeapAllocator> *)this->head == (BVSparse<Memory::HeapAllocator> *)0x0) {
      pBVar2 = (BVSparse<Memory::HeapAllocator> *)0x0;
      goto LAB_006ed72d;
    }
  }
  else {
    if (*(uint *)&pBVar1->lastFoundIndex == searchIndex) {
      *prevNextFieldOut = (Type_conflict *)pBVar3;
      return (BVSparseNode *)pBVar1;
    }
    if (searchIndex < *(uint *)&pBVar1->lastFoundIndex) goto LAB_006ed701;
  }
  do {
    pBVar2 = pBVar1;
    if (searchIndex <= *(uint *)&pBVar2->lastFoundIndex) {
      if (searchIndex != *(uint *)&pBVar2->lastFoundIndex) goto LAB_006ed72d;
      goto LAB_006ed73f;
    }
    pBVar1 = (BVSparse<Memory::HeapAllocator> *)pBVar2->head;
    pBVar3 = pBVar2;
  } while ((BVSparse<Memory::HeapAllocator> *)pBVar2->head != (BVSparse<Memory::HeapAllocator> *)0x0
          );
  pBVar2 = (BVSparse<Memory::HeapAllocator> *)0x0;
LAB_006ed72d:
  if (create) {
    pBVar2 = (BVSparse<Memory::HeapAllocator> *)Allocate(this,searchIndex,(BVSparseNode *)pBVar2);
    pBVar3->head = (Type_conflict)pBVar2;
LAB_006ed73f:
    *prevNextFieldOut = &pBVar3->head;
    this->lastUsedNodePrevNextField = &pBVar3->head;
  }
  else {
    pBVar2 = (BVSparse<Memory::HeapAllocator> *)0x0;
  }
  return (BVSparseNode *)pBVar2;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator)** prevNextFieldOut, bool create)
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator)* prevNextField = this->lastUsedNodePrevNextField;
    BVSparseNode* curNode = *prevNextField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    if(curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        this->lastUsedNodePrevNextField = prevNextField;
        return curNode;
    }

    if(!create)
    {
        return nullptr;
    }

    BVSparseNode * newNode = Allocate(searchIndex, *prevNextField);
    *prevNextField = newNode;
    *prevNextFieldOut = prevNextField;
    this->lastUsedNodePrevNextField = prevNextField;
    return newNode;
}